

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O3

void entity_move(entity *e,void *w,vec3 *delta_pos)

{
  float *pfVar1;
  vec3 *pvVar2;
  block_id block;
  int iVar3;
  int x;
  int y;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int iVar8;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dc_00;
  float extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  vec3 block_position;
  float local_ac;
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  float local_88;
  vec3 local_74;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  world *local_50;
  float local_48;
  
  local_a8._0_4_ = (e->box).max.y;
  iVar4 = 0;
  local_50 = (world *)w;
  do {
    fVar5 = roundf((e->box).min.y);
    fVar6 = (float)(int)(fVar5 + -1.0);
    fVar7 = roundf((float)local_a8._0_4_);
    if (fVar6 <= fVar7 + 1.0) {
      y = (int)(fVar5 + -1.0);
      local_ac = (e->box).max.x;
      do {
        fVar5 = roundf((e->box).min.x);
        local_68._4_4_ = (float)(int)extraout_XMM0_Db;
        local_68._0_4_ = (float)(int)(fVar5 + -1.0);
        fStack_60 = (float)(int)extraout_XMM0_Dc;
        fStack_5c = (float)(int)extraout_XMM0_Dd;
        fVar7 = roundf(local_ac);
        if ((float)local_68._0_4_ <= fVar7 + 1.0) {
          x = (int)(fVar5 + -1.0);
          local_88 = (e->box).max.z;
          do {
            local_48 = roundf((e->box).min.z);
            local_48 = local_48 + -1.0;
            iVar8 = (int)local_48;
            local_a8._4_4_ = (float)(int)extraout_XMM0_Db_00;
            local_a8._0_4_ = (float)iVar8;
            fStack_a0 = (float)(int)extraout_XMM0_Dc_00;
            fStack_9c = (float)(int)extraout_XMM0_Dd_00;
            fVar5 = roundf(local_88);
            if ((float)iVar8 <= fVar5 + 1.0) {
              iVar8 = (int)local_48;
              do {
                block = world_get_block(local_50,x,y,iVar8);
                iVar3 = block_is_obstacle(block);
                if (iVar3 != 0) {
                  local_74.x = (float)local_68._0_4_;
                  local_74.z = (float)local_a8._0_4_;
                  local_74.y = fVar6 + -0.5;
                  bounding_box_update(&block_box,&local_74);
                  if (iVar4 == 1) {
                    pfVar1 = &(e->box).min.z;
                    if ((((*pfVar1 <= block_box.max.z && block_box.max.z != *pfVar1) &&
                         (block_box.min.z < (e->box).max.z)) &&
                        (pfVar1 = &(e->box).min.y,
                        *pfVar1 <= block_box.max.y && block_box.max.y != *pfVar1)) &&
                       (block_box.min.y < (e->box).max.y)) {
                      fVar5 = delta_pos->x;
                      if (0.0 < fVar5) {
                        fVar7 = (e->box).max.x;
                        if ((fVar7 <= block_box.min.x) &&
                           (fVar7 = block_box.min.x - fVar7, fVar7 < fVar5)) {
                          delta_pos->x = fVar7;
                          fVar5 = fVar7;
                        }
                      }
                      if (fVar5 < 0.0) {
                        fVar7 = (e->box).min.x;
                        if ((block_box.max.x <= fVar7) &&
                           (fVar7 = block_box.max.x - fVar7, fVar5 < fVar7)) {
                          delta_pos->x = fVar7;
                        }
                      }
                    }
                  }
                  else if (iVar4 == 0) {
                    pfVar1 = &(e->box).min.z;
                    if ((((*pfVar1 <= block_box.max.z && block_box.max.z != *pfVar1) &&
                         (block_box.min.z < (e->box).max.z)) &&
                        (pvVar2 = &(e->box).min,
                        pvVar2->x <= block_box.max.x && block_box.max.x != pvVar2->x)) &&
                       (block_box.min.x < (e->box).max.x)) {
                      fVar5 = delta_pos->y;
                      if (0.0 < fVar5) {
                        fVar7 = (e->box).max.y;
                        if ((fVar7 <= block_box.min.y) &&
                           (fVar7 = block_box.min.y - fVar7, fVar7 < fVar5)) {
                          delta_pos->y = fVar7;
                          fVar5 = fVar7;
                        }
                      }
                      if (fVar5 < 0.0) {
                        fVar7 = (e->box).min.y;
                        if ((block_box.max.y <= fVar7) &&
                           (fVar7 = block_box.max.y - fVar7, fVar5 < fVar7)) {
                          delta_pos->y = fVar7;
                        }
                      }
                    }
                  }
                  else {
                    pvVar2 = &(e->box).min;
                    if ((((pvVar2->x <= block_box.max.x && block_box.max.x != pvVar2->x) &&
                         (block_box.min.x < (e->box).max.x)) &&
                        (pfVar1 = &(e->box).min.y,
                        *pfVar1 <= block_box.max.y && block_box.max.y != *pfVar1)) &&
                       (block_box.min.y < (e->box).max.y)) {
                      fVar5 = delta_pos->z;
                      if (0.0 < fVar5) {
                        fVar7 = (e->box).max.z;
                        if ((fVar7 <= block_box.min.z) &&
                           (fVar7 = block_box.min.z - fVar7, fVar7 < fVar5)) {
                          delta_pos->z = fVar7;
                          fVar5 = fVar7;
                        }
                      }
                      if (fVar5 < 0.0) {
                        fVar7 = (e->box).min.z;
                        if ((block_box.max.z <= fVar7) &&
                           (fVar7 = block_box.max.z - fVar7, fVar5 < fVar7)) {
                          delta_pos->z = fVar7;
                        }
                      }
                    }
                  }
                }
                iVar8 = iVar8 + 1;
                _local_a8 = ZEXT416((uint)(float)iVar8);
                local_88 = (e->box).max.z;
                fVar5 = roundf(local_88);
              } while ((float)iVar8 <= fVar5 + 1.0);
              local_ac = (e->box).max.x;
            }
            x = x + 1;
            _local_68 = ZEXT416((uint)(float)x);
            fVar5 = roundf(local_ac);
          } while ((float)local_68._0_4_ <= fVar5 + 1.0);
          fVar5 = (e->box).max.y;
        }
        else {
          fVar5 = (float)local_a8._0_4_;
        }
        y = y + 1;
        fVar6 = (float)y;
        local_a8._0_4_ = fVar5;
        fVar5 = roundf(fVar5);
      } while (fVar6 <= fVar5 + 1.0);
    }
    if (iVar4 == 0) {
      (e->box).min.y = delta_pos->y + (e->box).min.y;
      fVar6 = (float)local_a8._0_4_ + delta_pos->y;
      local_a8._0_4_ = fVar6;
      (e->box).max.y = fVar6;
    }
    else if (iVar4 == 1) {
      (e->box).min.x = delta_pos->x + (e->box).min.x;
      (e->box).max.x = delta_pos->x + (e->box).max.x;
    }
    iVar4 = iVar4 + 1;
  } while (iVar4 != 3);
  add_v3(&e->position,&e->position,delta_pos);
  return;
}

Assistant:

void entity_move(entity *e, void *w, vec3 *delta_pos)
{
    for (int axis = 0; axis < 3; axis++)
    {
        for (int y = roundf(e->box.min.y) - 1; y <= roundf(e->box.max.y) + 1; y++)
        {
            for (int x = roundf(e->box.min.x) - 1; x <= roundf(e->box.max.x) + 1; x++)
            {
                for (int z = roundf(e->box.min.z) - 1; z <= roundf(e->box.max.z) + 1; z++)
                {
                    if (!block_is_obstacle(world_get_block(w, x, y, z)))
                        continue;

                    vec3 block_position = {x, y - 0.5f, z};
                    bounding_box_update(&block_box, &block_position);

                    if (axis == 0)
                    {
                        if (e->box.min.z < block_box.max.z && e->box.max.z > block_box.min.z && e->box.min.x < block_box.max.x && e->box.max.x > block_box.min.x)
                        {
                            if (delta_pos->y > 0.0f && e->box.max.y <= block_box.min.y)
                            {
                                float difference = block_box.min.y - e->box.max.y;
                                if (difference < delta_pos->y)
                                    delta_pos->y = difference;
                            }
                            if (delta_pos->y < 0.0f && e->box.min.y >= block_box.max.y)
                            {
                                float difference = block_box.max.y - e->box.min.y;
                                if (difference > delta_pos->y)
                                    delta_pos->y = difference;
                            }
                        }
                    }
                    else if (axis == 1)
                    {
                        if (e->box.min.z < block_box.max.z && e->box.max.z > block_box.min.z && e->box.min.y < block_box.max.y && e->box.max.y > block_box.min.y)
                        {
                            if (delta_pos->x > 0.0f && e->box.max.x <= block_box.min.x)
                            {
                                float difference = block_box.min.x - e->box.max.x;
                                if (difference < delta_pos->x)
                                    delta_pos->x = difference;
                            }
                            if (delta_pos->x < 0.0f && e->box.min.x >= block_box.max.x)
                            {
                                float difference = block_box.max.x - e->box.min.x;
                                if (difference > delta_pos->x)
                                    delta_pos->x = difference;
                            }
                        }
                    }
                    else
                    {
                        if (e->box.min.x < block_box.max.x && e->box.max.x > block_box.min.x && e->box.min.y < block_box.max.y && e->box.max.y > block_box.min.y)
                        {
                            if (delta_pos->z > 0.0f && e->box.max.z <= block_box.min.z)
                            {
                                float difference = block_box.min.z - e->box.max.z;
                                if (difference < delta_pos->z)
                                    delta_pos->z = difference;
                            }
                            if (delta_pos->z < 0.0f && e->box.min.z >= block_box.max.z)
                            {
                                float difference = block_box.max.z - e->box.min.z;
                                if (difference > delta_pos->z)
                                    delta_pos->z = difference;
                            }
                        }
                    }
                }
            }
        }
        if (axis == 0)
        {
            e->box.min.y += delta_pos->y;
            e->box.max.y += delta_pos->y;
        }
        else if (axis == 1)
        {
            e->box.min.x += delta_pos->x;
            e->box.max.x += delta_pos->x;
        }
    }

    add_v3(&e->position, &e->position, delta_pos);
}